

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_storedIdentityHash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar1 = (ulong)(*(uint *)(uVar1 + 8) >> 6 & 0xfffffff0);
  }
  else {
    uVar1 = uVar1 * 0x41c64e6d0 & 0x7ffffffffffffff0;
  }
  return uVar1 | 0xb;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_storedIdentityHash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    if(sysbvm_tuple_isNonNullPointer(arguments[0]))
        return sysbvm_tuple_size_encode(context, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(arguments[0])->header.identityHashAndFlags >> SYSBVM_TUPLE_IDENTITY_HASH_SHIFT);

    return sysbvm_tuple_size_encode(context, sysbvm_hashMultiply(arguments[0]));
}